

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::MinimumSizeLabel::minimumSizeHint(MinimumSizeLabel *this)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  QSize QVar5;
  ulong uVar6;
  ulong uVar7;
  QPixmap aQStack_68 [24];
  QArrayDataPointer<char16_t> local_50;
  QPicture local_38 [24];
  
  QLabel::text();
  if (local_50.size == 0) {
    QLabel::pixmap();
    cVar1 = QPixmap::isNull();
    if ((cVar1 != '\0') && (lVar3 = QLabel::movie(), lVar3 == 0)) {
      QLabel::picture();
      cVar1 = QPicture::isNull();
      QPicture::~QPicture(local_38);
      QPixmap::~QPixmap(aQStack_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if (cVar1 != '\0') {
        QVar5.wd = 0;
        QVar5.ht = 0;
        return QVar5;
      }
      goto LAB_00174a56;
    }
    QPixmap::~QPixmap(aQStack_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
LAB_00174a56:
  uVar4 = QLabel::sizeHint();
  uVar7 = uVar4 >> 0x20;
  uVar2 = FingerGeometry::width();
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 <= (int)uVar4) {
    uVar6 = uVar4 & 0xffffffff;
  }
  uVar2 = FingerGeometry::height();
  if ((int)(uVar4 >> 0x20) < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  return (QSize)(uVar6 | uVar7 << 0x20);
}

Assistant:

QSize minimumSizeHint() const override
	{
		if( text().isEmpty() && pixmap( Qt::ReturnByValue ).isNull() && !movie() &&
			picture( Qt::ReturnByValue ).isNull() )
				return QSize( 0, 0 );
		else
		{
			const QSize labelSizeHint = QLabel::sizeHint();

			return QSize( qMax( labelSizeHint.width(), FingerGeometry::width() ),
				qMax( labelSizeHint.height(), FingerGeometry::height() ) );
		}
	}